

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall
MeasurementToString_unitWithNumbers_Test::TestBody(MeasurementToString_unitWithNumbers_Test *this)

{
  bool bVar1;
  measurement *measure;
  precise_measurement *measure_00;
  char *pcVar2;
  uint64_t in_RCX;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  AssertHelper local_108;
  Message local_100;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_1;
  Message local_d8;
  int local_d0;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  undefined1 local_a8 [8];
  string str2;
  string str1;
  precise_unit local_58;
  undefined1 local_48 [8];
  precise_measurement ounitp;
  unit local_28;
  undefined1 local_20 [8];
  measurement ounit;
  MeasurementToString_unitWithNumbers_Test *this_local;
  
  ounit.units_ = (unit)this;
  units::unit::pow((unit *)&units::kg,in_XMM0_Qa,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  units::unit::unit(&local_28,0.712412,(unit *)&ounitp.units_.base_units_);
  _local_20 = units::operator*(10.0,&local_28);
  str1.field_2._8_8_ =
       units::precise_unit::pow
                 ((precise_unit *)units::precise::kg,local_20,
                  (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  units::precise_unit::precise_unit(&local_58,0.712412,(precise_unit *)((long)&str1.field_2 + 8));
  units::operator*((precise_measurement *)local_48,10.0,&local_58);
  measure = (measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)((long)&str2.field_2 + 8),(units *)local_20,measure,in_RCX);
  measure_00 = (precise_measurement *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)local_a8,(units *)local_48,measure_00,in_RCX);
  local_cc = std::__cxx11::string::compare((ulong)((long)&str2.field_2 + 8),0,(char *)0xb);
  local_d0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_c8,"str1.compare(0, 11, \"10 (0.71241\")","0",&local_cc,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_f4 = std::__cxx11::string::compare((ulong)local_a8,0,(char *)0xb);
  local_f8 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f0,"str2.compare(0, 11, \"10 (0.71241\")","0",&local_f4,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_108,&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(str2.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST(MeasurementToString, unitWithNumbers)
{
    measurement ounit = 10.0 * unit(0.712412, kg.pow(2));
    precise_measurement ounitp =
        10.0 * precise_unit(0.712412, precise::kg.pow(2));
    auto str1 = to_string(ounit);
    auto str2 = to_string(ounitp);
    EXPECT_EQ(str1.compare(0, 11, "10 (0.71241"), 0);
    EXPECT_EQ(str2.compare(0, 11, "10 (0.71241"), 0);
}